

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

bool __thiscall CallStatement::callFinder(CallStatement *this,Token *id)

{
  pointer pcVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  vector<Function_*,_std::allocator<Function_*>_> local_88;
  vector<Function_*,_std::allocator<Function_*>_> local_68;
  long *local_50;
  pointer local_48;
  long local_40 [2];
  
  uVar6 = 0;
  do {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              (&local_88,&(this->super_Functions)._functionStack);
    ppFVar3 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar2 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((ulong)((long)ppFVar3 - (long)ppFVar2 >> 3) <= uVar6) {
      return true;
    }
    local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    pcVar1 = (id->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + (id->_name)._M_string_length);
    std::vector<Function_*,_std::allocator<Function_*>_>::vector
              (&local_68,&(this->super_Functions)._functionStack);
    (*(local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
       super__Vector_impl_data._M_start[uVar6]->super_Statement)._vptr_Statement[3])(&local_50);
    plVar4 = local_50;
    if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish == local_48) {
      if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
          super__Vector_impl_data._M_finish == (pointer)0x0) {
        bVar7 = true;
      }
      else {
        iVar5 = bcmp(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                     super__Vector_impl_data._M_start,local_50,
                     (size_t)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        bVar7 = iVar5 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (plVar4 != local_40) {
      operator_delete(plVar4,local_40[0] + 1);
    }
    if (local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    uVar6 = uVar6 + 1;
  } while (!bVar7);
  return true;
}

Assistant:

bool CallStatement::callFinder(const Token& id){
    for(int i = 0; i < getFunctionStack().size();i++) {
        if (id.getName() == getFunctionStack()[i]->id())
            return true;
    }
}